

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_do(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  IMAP *pIVar2;
  CURLcode CVar3;
  char *pcVar4;
  char *pcVar5;
  
  *done = false;
  CVar3 = Curl_urldecode(data,(data->state).up.path + 1,0,&((data->req).p.file)->freepath,
                         (size_t *)0x0,REJECT_CTRL);
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  pcVar5 = (data->set).str[6];
  if ((pcVar5 != (char *)0x0) &&
     (CVar3 = Curl_urldecode(data,pcVar5,0,&((data->req).p.http)->postdata,(size_t *)0x0,REJECT_CTRL
                            ), CVar3 != CURLE_OK)) {
    return CVar3;
  }
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  pcVar1 = data->conn;
  if (((data->set).field_0x9a3 & 0x10) != 0) {
    ((data->req).p.imap)->transfer = PPTRANSFER_INFO;
  }
  *done = false;
  pIVar2 = (data->req).p.imap;
  if (*pIVar2->mailbox == '\0') {
LAB_00135032:
    pcVar5 = pIVar2->uidvalidity;
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      pcVar5 = "LIST";
    }
    CVar3 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s",pcVar5);
  }
  else {
    if (((data->set).field_0x9a1 & 0x20) == 0) {
      pcVar5 = "RETR";
    }
    else {
      pIVar2->transfer = PPTRANSFER_INFO;
      if (*pIVar2->mailbox == '\0') goto LAB_00135032;
      pcVar5 = "LIST";
    }
    pcVar4 = pIVar2->uidvalidity;
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      pcVar4 = pcVar5;
    }
    CVar3 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s %s",pcVar4);
  }
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  (data->conn->proto).imapc.state = IMAP_FETCH;
  CVar3 = pop3_multi_statemach(data,done);
  return CVar3;
}

Assistant:

static CURLcode pop3_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = pop3_parse_url_path(data);
  if(result)
    return result;

  /* Parse the custom request */
  result = pop3_parse_custom_request(data);
  if(result)
    return result;

  result = pop3_regular_transfer(data, done);

  return result;
}